

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QUrlModel::WatchItem>::reallocateAndGrow
          (QArrayDataPointer<QUrlModel::WatchItem> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QUrlModel::WatchItem> *old)

{
  WatchItem *pWVar1;
  QArrayData *pQVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  Data *pDVar5;
  bool bVar6;
  quintptr qVar7;
  int iVar8;
  WatchItem *pWVar9;
  WatchItem *pWVar10;
  qsizetype qVar11;
  long lVar12;
  long in_FS_OFFSET;
  undefined1 auVar13 [16];
  QArrayDataPointer<QUrlModel::WatchItem> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QUrlModel::WatchItem> *)0x0 && where == GrowsAtEnd) {
    pQVar2 = &this->d->super_QArrayData;
    if (pQVar2 == (QArrayData *)0x0) {
      bVar6 = true;
    }
    else {
      bVar6 = 1 < (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar6)) {
      if (pQVar2 == (QArrayData *)0x0) {
        qVar11 = 0;
        lVar12 = 0;
      }
      else {
        qVar11 = pQVar2->alloc;
        lVar12 = (this->size - pQVar2->alloc) +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pQVar2[1].alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
                 -0x5555555555555555;
      }
      auVar13 = QArrayData::reallocateUnaligned(pQVar2,this->ptr,0x30,qVar11 + n + lVar12,Grow);
      this->d = (Data *)auVar13._0_8_;
      this->ptr = (WatchItem *)auVar13._8_8_;
      goto LAB_00501e12;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (WatchItem *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if (this->size != 0) {
    lVar12 = this->size + (n >> 0x3f & n);
    if (this->d == (Data *)0x0) {
      bVar6 = true;
    }
    else {
      bVar6 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    pWVar9 = this->ptr;
    pWVar10 = pWVar9 + lVar12;
    if ((old != (QArrayDataPointer<QUrlModel::WatchItem> *)0x0) || (bVar6)) {
      if ((lVar12 != 0) && (0 < lVar12)) {
        do {
          local_38.ptr[local_38.size].index.m.ptr = (pWVar9->index).m.ptr;
          iVar8 = (pWVar9->index).c;
          qVar7 = (pWVar9->index).i;
          pWVar1 = local_38.ptr + local_38.size;
          (pWVar1->index).r = (pWVar9->index).r;
          (pWVar1->index).c = iVar8;
          (pWVar1->index).i = qVar7;
          pDVar3 = (pWVar9->path).d.d;
          local_38.ptr[local_38.size].path.d.d = pDVar3;
          local_38.ptr[local_38.size].path.d.ptr = (pWVar9->path).d.ptr;
          local_38.ptr[local_38.size].path.d.size = (pWVar9->path).d.size;
          if (pDVar3 != (Data *)0x0) {
            LOCK();
            (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pWVar9 = pWVar9 + 1;
          local_38.size = local_38.size + 1;
        } while (pWVar9 < pWVar10);
      }
    }
    else if ((lVar12 != 0) && (0 < lVar12)) {
      do {
        local_38.ptr[local_38.size].index.m.ptr = (pWVar9->index).m.ptr;
        iVar8 = (pWVar9->index).c;
        qVar7 = (pWVar9->index).i;
        pWVar1 = local_38.ptr + local_38.size;
        (pWVar1->index).r = (pWVar9->index).r;
        (pWVar1->index).c = iVar8;
        (pWVar1->index).i = qVar7;
        pDVar3 = (pWVar9->path).d.d;
        (pWVar9->path).d.d = (Data *)0x0;
        local_38.ptr[local_38.size].path.d.d = pDVar3;
        pcVar4 = (pWVar9->path).d.ptr;
        (pWVar9->path).d.ptr = (char16_t *)0x0;
        local_38.ptr[local_38.size].path.d.ptr = pcVar4;
        qVar11 = (pWVar9->path).d.size;
        (pWVar9->path).d.size = 0;
        local_38.ptr[local_38.size].path.d.size = qVar11;
        pWVar9 = pWVar9 + 1;
        local_38.size = local_38.size + 1;
      } while (pWVar9 < pWVar10);
    }
  }
  pDVar5 = this->d;
  pWVar9 = this->ptr;
  this->d = local_38.d;
  this->ptr = local_38.ptr;
  qVar11 = this->size;
  this->size = local_38.size;
  local_38.d = pDVar5;
  local_38.ptr = pWVar9;
  local_38.size = qVar11;
  if (old != (QArrayDataPointer<QUrlModel::WatchItem> *)0x0) {
    local_38.d = old->d;
    local_38.ptr = old->ptr;
    old->d = pDVar5;
    old->ptr = pWVar9;
    local_38.size = old->size;
    old->size = qVar11;
  }
  ~QArrayDataPointer(&local_38);
LAB_00501e12:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }